

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

ssize_t __thiscall Fl_Preferences::Node::write(Node *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  size_t __n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  size_t __size;
  undefined4 in_register_00000034;
  FILE *__stream;
  char *__ptr;
  
  __stream = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->next_ != (Node *)0x0) {
    write(this->next_,__fd,__buf,__n);
  }
  fprintf(__stream,"\n[%s]\n\n",this->path_);
  __buf_00 = extraout_RDX;
  for (__n_00 = 0; (long)__n_00 < (long)this->nEntry_; __n_00 = __n_00 + 1) {
    pcVar1 = this->entry_[__n_00].name;
    __ptr = this->entry_[__n_00].value;
    if (__ptr == (char *)0x0) {
      fprintf(__stream,"%s\n",pcVar1);
      __buf_00 = extraout_RDX_01;
    }
    else {
      fprintf(__stream,"%s:",pcVar1);
      for (__size = 0; (__size != 0x3c && (__ptr[__size] != '\0')); __size = __size + 1) {
      }
      while( true ) {
        fwrite(__ptr,__size,1,__stream);
        fputc(10,__stream);
        __ptr = __ptr + __size;
        __buf_00 = extraout_RDX_00;
        if (*__ptr == '\0') break;
        for (__size = 0; (__size != 0x50 && (__ptr[__size] != '\0')); __size = __size + 1) {
        }
        fputc(0x2b,__stream);
      }
    }
  }
  if (this->child_ != (Node *)0x0) {
    write(this->child_,__fd,__buf_00,__n_00);
  }
  this->field_0x30 = this->field_0x30 & 0xfe;
  return 0;
}

Assistant:

int Fl_Preferences::Node::write( FILE *f ) {
  if ( next_ ) next_->write( f );
  fprintf( f, "\n[%s]\n\n", path_ );
  for ( int i = 0; i < nEntry_; i++ ) {
    char *src = entry_[i].value;
    if ( src ) {		// hack it into smaller pieces if needed
      fprintf( f, "%s:", entry_[i].name );
      size_t cnt, written = 0;
      for ( cnt = 0; cnt < 60; cnt++ )
	if ( src[cnt]==0 ) break;
      written += fwrite( src, cnt, 1, f );
      fprintf( f, "\n" );
      src += cnt;
      for (;*src;) {
	for ( cnt = 0; cnt < 80; cnt++ )
	  if ( src[cnt]==0 ) break;
        fputc( '+', f );
	written += fwrite( src, cnt, 1, f );
        fputc( '\n', f );
	src += cnt;
      }
    }
    else
      fprintf( f, "%s\n", entry_[i].name );
  }
  if ( child_ ) child_->write( f );
  dirty_ = 0;
  return 0;
}